

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O3

void fdct4x4_sse4_1(__m128i *in,__m128i *out,int bit,int num_col)

{
  __m128i *palVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int iVar13;
  int iVar15;
  int iVar16;
  undefined1 auVar14 [16];
  int iVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  
  auVar11 = ZEXT416((uint)bit);
  lVar10 = (long)bit * 0x100;
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar10 + 0x1e0);
  auVar22._4_4_ = uVar2;
  auVar22._0_4_ = uVar2;
  auVar22._8_4_ = uVar2;
  auVar22._12_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar10 + 0x220);
  uVar3 = *(undefined4 *)((long)vert_filter_length_chroma + lVar10 + 0x1a0);
  iVar9 = 1 << ((char)bit - 1U & 0x1f);
  iVar13 = (int)(*in)[0];
  iVar15 = *(int *)((long)*in + 4);
  iVar16 = (int)(*in)[1];
  iVar17 = *(int *)((long)*in + 0xc);
  palVar1 = in + num_col * 3;
  iVar5 = (int)(*palVar1)[0];
  iVar6 = *(int *)((long)*palVar1 + 4);
  iVar7 = (int)(*palVar1)[1];
  iVar8 = *(int *)((long)*palVar1 + 0xc);
  auVar20._0_4_ = iVar5 + iVar13;
  auVar20._4_4_ = iVar6 + iVar15;
  auVar20._8_4_ = iVar7 + iVar16;
  auVar20._12_4_ = iVar8 + iVar17;
  auVar12._0_4_ = iVar13 - iVar5;
  auVar12._4_4_ = iVar15 - iVar6;
  auVar12._8_4_ = iVar16 - iVar7;
  auVar12._12_4_ = iVar17 - iVar8;
  palVar1 = in + num_col;
  iVar13 = (int)(*palVar1)[0];
  iVar15 = *(int *)((long)*palVar1 + 4);
  iVar16 = (int)(*palVar1)[1];
  iVar17 = *(int *)((long)*palVar1 + 0xc);
  palVar1 = in + num_col * 2;
  iVar5 = (int)(*palVar1)[0];
  iVar6 = *(int *)((long)*palVar1 + 4);
  iVar7 = (int)(*palVar1)[1];
  iVar8 = *(int *)((long)*palVar1 + 0xc);
  auVar21._0_4_ = iVar5 + iVar13;
  auVar21._4_4_ = iVar6 + iVar15;
  auVar21._8_4_ = iVar7 + iVar16;
  auVar21._12_4_ = iVar8 + iVar17;
  auVar18._0_4_ = iVar13 - iVar5;
  auVar18._4_4_ = iVar15 - iVar6;
  auVar18._8_4_ = iVar16 - iVar7;
  auVar18._12_4_ = iVar17 - iVar8;
  auVar14 = pmulld(auVar20,auVar22);
  auVar22 = pmulld(auVar21,auVar22);
  iVar13 = auVar14._0_4_ + iVar9;
  iVar15 = auVar14._4_4_ + iVar9;
  iVar16 = auVar14._8_4_ + iVar9;
  iVar17 = auVar14._12_4_ + iVar9;
  auVar14._4_4_ = uVar2;
  auVar14._0_4_ = uVar2;
  auVar14._8_4_ = uVar2;
  auVar14._12_4_ = uVar2;
  auVar20 = pmulld(auVar18,auVar14);
  auVar23._4_4_ = uVar3;
  auVar23._0_4_ = uVar3;
  auVar23._8_4_ = uVar3;
  auVar23._12_4_ = uVar3;
  auVar23 = pmulld(auVar12,auVar23);
  auVar19._4_4_ = uVar2;
  auVar19._0_4_ = uVar2;
  auVar19._8_4_ = uVar2;
  auVar19._12_4_ = uVar2;
  auVar14 = pmulld(auVar12,auVar19);
  auVar4._4_4_ = uVar3;
  auVar4._0_4_ = uVar3;
  auVar4._8_4_ = uVar3;
  auVar4._12_4_ = uVar3;
  auVar19 = pmulld(auVar18,auVar4);
  *(int *)*out = iVar13 + auVar22._0_4_ >> auVar11;
  *(int *)((long)*out + 4) = iVar15 + auVar22._4_4_ >> auVar11;
  *(int *)(*out + 1) = iVar16 + auVar22._8_4_ >> auVar11;
  *(int *)((long)*out + 0xc) = iVar17 + auVar22._12_4_ >> auVar11;
  *(int *)out[1] = auVar23._0_4_ + iVar9 + auVar20._0_4_ >> auVar11;
  *(int *)((long)out[1] + 4) = auVar23._4_4_ + iVar9 + auVar20._4_4_ >> auVar11;
  *(int *)(out[1] + 1) = auVar23._8_4_ + iVar9 + auVar20._8_4_ >> auVar11;
  *(int *)((long)out[1] + 0xc) = auVar23._12_4_ + iVar9 + auVar20._12_4_ >> auVar11;
  *(int *)out[2] = iVar13 - auVar22._0_4_ >> auVar11;
  *(int *)((long)out[2] + 4) = iVar15 - auVar22._4_4_ >> auVar11;
  *(int *)(out[2] + 1) = iVar16 - auVar22._8_4_ >> auVar11;
  *(int *)((long)out[2] + 0xc) = iVar17 - auVar22._12_4_ >> auVar11;
  *(int *)out[3] = (auVar14._0_4_ + iVar9) - auVar19._0_4_ >> auVar11;
  *(int *)((long)out[3] + 4) = (auVar14._4_4_ + iVar9) - auVar19._4_4_ >> auVar11;
  *(int *)(out[3] + 1) = (auVar14._8_4_ + iVar9) - auVar19._8_4_ >> auVar11;
  *(int *)((long)out[3] + 0xc) = (auVar14._12_4_ + iVar9) - auVar19._12_4_ >> auVar11;
  return;
}

Assistant:

static void fdct4x4_sse4_1(__m128i *in, __m128i *out, int bit,
                           const int num_col) {
  const int32_t *cospi = cospi_arr(bit);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i cospi48 = _mm_set1_epi32(cospi[48]);
  const __m128i cospi16 = _mm_set1_epi32(cospi[16]);
  const __m128i rnding = _mm_set1_epi32(1 << (bit - 1));
  __m128i s0, s1, s2, s3;
  __m128i u0, u1, u2, u3;
  __m128i v0, v1, v2, v3;

  int endidx = 3 * num_col;
  s0 = _mm_add_epi32(in[0], in[endidx]);
  s3 = _mm_sub_epi32(in[0], in[endidx]);
  endidx -= num_col;
  s1 = _mm_add_epi32(in[num_col], in[endidx]);
  s2 = _mm_sub_epi32(in[num_col], in[endidx]);

  // btf_32_sse4_1_type0(cospi32, cospi32, s[01], u[02], bit);
  u0 = _mm_mullo_epi32(s0, cospi32);
  u1 = _mm_mullo_epi32(s1, cospi32);
  u2 = _mm_add_epi32(u0, u1);
  v0 = _mm_sub_epi32(u0, u1);

  u3 = _mm_add_epi32(u2, rnding);
  v1 = _mm_add_epi32(v0, rnding);

  u0 = _mm_srai_epi32(u3, bit);
  u2 = _mm_srai_epi32(v1, bit);

  // btf_32_sse4_1_type1(cospi48, cospi16, s[23], u[13], bit);
  v0 = _mm_mullo_epi32(s2, cospi48);
  v1 = _mm_mullo_epi32(s3, cospi16);
  v2 = _mm_add_epi32(v0, v1);

  v3 = _mm_add_epi32(v2, rnding);
  u1 = _mm_srai_epi32(v3, bit);

  v0 = _mm_mullo_epi32(s2, cospi16);
  v1 = _mm_mullo_epi32(s3, cospi48);
  v2 = _mm_sub_epi32(v1, v0);

  v3 = _mm_add_epi32(v2, rnding);
  u3 = _mm_srai_epi32(v3, bit);

  // Note: shift[1] and shift[2] are zeros

  out[0] = u0;
  out[1] = u1;
  out[2] = u2;
  out[3] = u3;
}